

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

int lj_opt_fwd_tptr(jit_State *J,IRRef lim)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  IRIns *pIVar4;
  AliasRet AVar5;
  int iVar6;
  IRRef1 *pIVar7;
  
  uVar1 = (J->fold).ins.field_0.op1;
  pIVar7 = J->chain + 0x3b;
  while( true ) {
    uVar2 = *pIVar7;
    if (uVar2 <= lim) {
      iVar6 = fwd_aa_tab_clear(J,lim,(uint)uVar1);
      return iVar6;
    }
    pIVar4 = (J->cur).ir;
    uVar3 = pIVar4[uVar2].field_0.op1;
    if (uVar1 == uVar3) break;
    AVar5 = aa_table(J,(uint)uVar1,(uint)uVar3);
    pIVar7 = &(&pIVar4->field_0)[uVar2].prev;
    if (AVar5 != ALIAS_NO) {
      return 0;
    }
  }
  return 0;
}

Assistant:

int LJ_FASTCALL lj_opt_fwd_tptr(jit_State *J, IRRef lim)
{
  IRRef ta = fins->op1;
  IRRef ref = J->chain[IR_NEWREF];
  while (ref > lim) {
    IRIns *newref = IR(ref);
    if (ta == newref->op1 || aa_table(J, ta, newref->op1) != ALIAS_NO)
      return 0;  /* Conflict. */
    ref = newref->prev;
  }
  return fwd_aa_tab_clear(J, lim, ta);
}